

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall
node::BlockManager::WriteBlockToDisk(BlockManager *this,CBlock *block,FlatFilePos *pos)

{
  SizeComputer SVar1;
  SizeComputer __stream;
  long lVar2;
  size_t in_RCX;
  bool bVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  TransactionSerParams *fmt;
  SizeComputer *args;
  vector<std::byte,_std::allocator<std::byte>_> local_68;
  SizeComputer local_48;
  VectorFormatter<DefaultFormatter> local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __stream.nSize = (size_t)FlatFileSeq::Open(&this->m_block_file_seq,pos,false);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&local_68,&this->m_xor_key);
  fmt = (TransactionSerParams *)
        local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start;
  if ((FILE *)__stream.nSize == (FILE *)0x0) {
    logging_function._M_str = "WriteBlockToDisk";
    logging_function._M_len = 0x10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintf_<char[17]>
              (logging_function,source_file,0x3cf,
               IPC|MEMPOOLREJ|PRUNE|CMPCTBLOCK|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|WALLETDB|ZMQ|
               MEMPOOL|TOR|NET,Trace,
               (char *)local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start,
               (char (*) [17])
               local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish);
    bVar3 = false;
  }
  else {
    local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = &::TX_WITH_WITNESS.allow_witness;
    local_48.nSize = 0x50;
    args = (SizeComputer *)
           local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_48;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
              (&local_39,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_68,&block->vtx
              );
    SVar1.nSize = local_48.nSize;
    AutoFile::write((AutoFile *)&stack0xffffffffffffff78,(int)(this->m_opts).chainparams + 0x170,
                    (void *)0x4,in_RCX);
    local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,(int)SVar1.nSize);
    AutoFile::write((AutoFile *)&stack0xffffffffffffff78,(int)&local_68,(void *)0x4,in_RCX);
    lVar2 = ftell((FILE *)__stream.nSize);
    bVar3 = lVar2 >= 0;
    if (lVar2 < 0) {
      logging_function_00._M_str = "WriteBlockToDisk";
      logging_function_00._M_len = 0x10;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_00._M_len = 0x5e;
      LogPrintf_<char[17]>
                (logging_function_00,source_file_00,0x3da,
                 IPC|MEMPOOLREJ|PRUNE|CMPCTBLOCK|SELECTCOINS|WALLETDB|ZMQ,(Level)__stream.nSize,
                 &fmt->allow_witness,(char (*) [17])args);
    }
    else {
      pos->nPos = (uint)lVar2;
      local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = &::TX_WITH_WITNESS.allow_witness;
      local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&stack0xffffffffffffff78;
      CBlock::
      SerializationOps<ParamsStream<AutoFile&,TransactionSerParams>,CBlock_const,ActionSerialize>
                (block);
    }
  }
  AutoFile::~AutoFile((AutoFile *)&stack0xffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::WriteBlockToDisk(const CBlock& block, FlatFilePos& pos) const
{
    // Open history file to append
    AutoFile fileout{OpenBlockFile(pos)};
    if (fileout.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }

    // Write index header
    unsigned int nSize = GetSerializeSize(TX_WITH_WITNESS(block));
    fileout << GetParams().MessageStart() << nSize;

    // Write block
    long fileOutPos = ftell(fileout.Get());
    if (fileOutPos < 0) {
        LogError("%s: ftell failed\n", __func__);
        return false;
    }
    pos.nPos = (unsigned int)fileOutPos;
    fileout << TX_WITH_WITNESS(block);

    return true;
}